

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O1

void Gem_FuncExpand(Gem_Man_t *p,int f,int i)

{
  ulong *puVar1;
  ushort uVar2;
  int iVar3;
  Vec_Mem_t *pVVar4;
  Gem_Obj_t *pGVar5;
  word **ppwVar6;
  word *pTruth;
  word *pCof0;
  word *pCof1;
  ulong uVar7;
  ulong uVar8;
  word wVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  byte bVar13;
  byte bVar14;
  uint uVar15;
  word *pwVar16;
  ulong uVar17;
  word *pwVar18;
  uint uVar19;
  word *pwVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint *pLimitU;
  char pCanonPermC [16];
  char local_48 [24];
  
  if ((f < 0) || (pVVar4 = p->vTtMem, pVVar4->nEntries <= f)) {
    __assert_fail("i >= 0 && i < p->nEntries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                  ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
  }
  pGVar5 = p->pObjs;
  if ((int)(*(uint *)(pGVar5 + f) & 0xf) <= i) {
    __assert_fail("i < (int)pObj->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0xde,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
  }
  iVar10 = p->nVars;
  if ((int)((*(uint *)(pGVar5 + f) & 0xf) + 2) <= iVar10) {
    iVar3 = p->nObjs;
    ppwVar6 = p->pTtElems;
    pTruth = ppwVar6[iVar10];
    pCof0 = ppwVar6[(long)iVar10 + 2];
    pCof1 = ppwVar6[(long)iVar10 + 3];
    iVar10 = p->nWords;
    if (0 < (long)iVar10) {
      uVar15 = pVVar4->PageMask;
      iVar11 = pVVar4->nEntrySize;
      pwVar16 = pVVar4->ppPages[(uint)f >> ((byte)pVVar4->LogPageSze & 0x1f)];
      lVar22 = 0;
      do {
        pTruth[lVar22] = pwVar16[(int)((uVar15 & f) * iVar11) + lVar22];
        lVar22 = lVar22 + 1;
      } while (iVar10 != lVar22);
    }
    uVar15 = (*(uint *)(pGVar5 + f) & 0xf) - 1;
    uVar17 = (ulong)uVar15;
    uVar12 = (ulong)(uint)i;
    if (i < (int)uVar15) {
      uVar12 = (ulong)i;
      do {
        uVar15 = p->nWords;
        if ((long)uVar12 < 5) {
          if (0 < (int)uVar15) {
            uVar17 = s_PMasks[uVar12][0];
            uVar23 = s_PMasks[uVar12][1];
            uVar7 = s_PMasks[uVar12][2];
            uVar24 = 0;
            do {
              uVar8 = pTruth[uVar24];
              bVar13 = (byte)(1 << ((byte)uVar12 & 0x1f));
              pTruth[uVar24] =
                   (uVar8 & uVar7) >> (bVar13 & 0x3f) |
                   (uVar8 & uVar23) << (bVar13 & 0x3f) | uVar8 & uVar17;
              uVar24 = uVar24 + 1;
            } while (uVar15 != uVar24);
          }
        }
        else if (uVar12 == 5) {
          pwVar16 = pTruth;
          if (0 < (int)uVar15) {
            do {
              puVar1 = (ulong *)((long)pwVar16 + 4);
              *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
              pwVar16 = pwVar16 + 2;
            } while (pwVar16 < pTruth + (int)uVar15);
          }
        }
        else if (0 < (int)uVar15) {
          uVar19 = 1 << ((byte)uVar12 - 6 & 0x1f);
          if ((long)uVar12 < 7) {
            uVar19 = 1;
          }
          iVar10 = uVar19 * 4;
          pwVar16 = pTruth + uVar19 * 2;
          pwVar18 = pTruth + uVar19;
          pwVar20 = pTruth;
          do {
            if (0 < (int)uVar19) {
              uVar17 = 0;
              do {
                wVar9 = pwVar18[uVar17];
                pwVar18[uVar17] = pwVar16[uVar17];
                pwVar16[uVar17] = wVar9;
                uVar17 = uVar17 + 1;
              } while (uVar19 != uVar17);
            }
            pwVar20 = pwVar20 + iVar10;
            pwVar16 = pwVar16 + iVar10;
            pwVar18 = pwVar18 + iVar10;
          } while (pwVar20 < pTruth + (int)uVar15);
        }
        uVar12 = uVar12 + 1;
        uVar17 = (ulong)(*(uint *)(pGVar5 + f) & 0xf) - 1;
      } while ((long)uVar12 < (long)uVar17);
    }
    iVar10 = (int)uVar12;
    if (iVar10 != (int)uVar17) {
      __assert_fail("v == (int)pObj->nVars-1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                    ,0xe5,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
    }
    uVar15 = p->nWords;
    uVar17 = (ulong)uVar15;
    lVar22 = (long)(int)uVar15;
    bVar13 = (byte)uVar12;
    if (uVar17 == 1) {
      *pCof0 = (s_Truths6Neg[iVar10] & *pTruth) << ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
               s_Truths6Neg[iVar10] & *pTruth;
    }
    else if (iVar10 < 6) {
      if (0 < (int)uVar15) {
        uVar12 = s_Truths6Neg[iVar10];
        uVar23 = 0;
        do {
          pCof0[uVar23] =
               (pTruth[uVar23] & uVar12) << ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
               pTruth[uVar23] & uVar12;
          uVar23 = uVar23 + 1;
        } while (uVar17 != uVar23);
      }
    }
    else if (0 < (int)uVar15) {
      bVar14 = (byte)(iVar10 + -6);
      uVar19 = 1 << (bVar14 & 0x1f);
      iVar11 = 2 << (bVar14 & 0x1f);
      uVar12 = 1;
      if (1 < (int)uVar19) {
        uVar12 = (ulong)uVar19;
      }
      pwVar16 = pCof0 + (int)uVar19;
      pwVar18 = pCof0;
      pwVar20 = pTruth;
      do {
        if (iVar10 + -6 != 0x1f) {
          uVar23 = 0;
          do {
            pwVar18[uVar23] = pwVar20[uVar23];
            pwVar16[uVar23] = pwVar20[uVar23];
            uVar23 = uVar23 + 1;
          } while (uVar12 != uVar23);
        }
        pwVar20 = pwVar20 + iVar11;
        pwVar16 = pwVar16 + iVar11;
        pwVar18 = pwVar18 + iVar11;
      } while (pwVar20 < pTruth + lVar22);
    }
    if (uVar15 == 1) {
      *pCof1 = (s_Truths6[iVar10] & *pTruth) >> ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
               s_Truths6[iVar10] & *pTruth;
    }
    else if (iVar10 < 6) {
      if (0 < (int)uVar15) {
        uVar12 = s_Truths6[iVar10];
        uVar23 = 0;
        do {
          pCof1[uVar23] =
               (pTruth[uVar23] & uVar12) >> ((byte)(1 << (bVar13 & 0x1f)) & 0x3f) |
               pTruth[uVar23] & uVar12;
          uVar23 = uVar23 + 1;
        } while (uVar17 != uVar23);
      }
    }
    else if (0 < (int)uVar15) {
      bVar13 = (byte)(iVar10 + -6);
      uVar19 = 1 << (bVar13 & 0x1f);
      iVar11 = 2 << (bVar13 & 0x1f);
      uVar12 = 1;
      pwVar16 = pTruth;
      pwVar18 = pCof1;
      if (1 < (int)uVar19) {
        uVar12 = (ulong)uVar19;
      }
      do {
        if (iVar10 + -6 != 0x1f) {
          uVar17 = 0;
          do {
            pwVar18[uVar17] = pwVar16[(long)(int)uVar19 + uVar17];
            pwVar18[(long)(int)uVar19 + uVar17] = pwVar16[(long)(int)uVar19 + uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar12 != uVar17);
        }
        pwVar16 = pwVar16 + iVar11;
        pwVar18 = pwVar18 + iVar11;
      } while (pwVar16 < pTruth + lVar22);
    }
    if (0 < (int)uVar15) {
      pwVar16 = ppwVar6[iVar10];
      pwVar18 = ppwVar6[(long)iVar10 + 1];
      pwVar20 = ppwVar6[(long)iVar10 + 2];
      lVar21 = 0;
      do {
        pTruth[lVar21] =
             pwVar20[lVar21] & pwVar18[lVar21] |
             (pwVar20[lVar21] | pwVar18[lVar21]) & pwVar16[lVar21];
        lVar21 = lVar21 + 1;
      } while (lVar22 != lVar21);
      if (0 < (int)uVar15) {
        lVar21 = 0;
        do {
          pTruth[lVar21] = (pCof1[lVar21] ^ pCof0[lVar21]) & pTruth[lVar21] ^ pCof0[lVar21];
          lVar21 = lVar21 + 1;
        } while (lVar22 != lVar21);
      }
    }
    Abc_TtCanonicizePerm(pTruth,(*(uint *)(pGVar5 + f) & 0xf) + 2,local_48);
    uVar19 = *(uint *)(pGVar5 + f) & 0xf;
    uVar15 = 4;
    if (4 < uVar19) {
      uVar15 = uVar19;
    }
    iVar10 = p->nVars;
    if (uVar15 + 2 != iVar10) {
      if (iVar10 <= (int)(uVar15 + 2)) {
        __assert_fail("nVarS < nVarB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x47d,"void Abc_TtStretch6(word *, int, int)");
      }
      uVar15 = 1 << ((char)uVar15 - 4U & 0x1f);
      if (uVar19 < 5) {
        uVar15 = 1;
      }
      uVar19 = 1 << ((byte)(iVar10 + -6) & 0x1f);
      if (uVar15 != uVar19) {
        if ((int)uVar19 <= (int)uVar15) {
          __assert_fail("step < nWords",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                        ,0x482,"void Abc_TtStretch6(word *, int, int)");
        }
        if (iVar10 + -6 != 0x1f) {
          uVar12 = (ulong)uVar15;
          uVar17 = 0;
          pwVar16 = pTruth;
          do {
            uVar23 = 0;
            do {
              pwVar16[uVar23] = pTruth[uVar23];
              uVar23 = uVar23 + 1;
            } while (uVar12 != uVar23);
            uVar17 = uVar17 + uVar12;
            pwVar16 = pwVar16 + uVar12;
          } while (uVar17 < uVar19);
        }
      }
    }
    iVar10 = Vec_MemHashInsert(p->vTtMem,pTruth);
    if (p->nObjs <= iVar10) {
      if (iVar10 != p->nObjs) {
        __assert_fail("iFunc == p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                      ,0xf2,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
      }
      uVar15 = *(uint *)(pGVar5 + iVar3);
      uVar19 = *(int *)(pGVar5 + f) + 2U & 0xf;
      *(uint *)(pGVar5 + iVar3) = uVar15 & 0xfffffff0 | uVar19;
      *(uint *)(pGVar5 + iVar3) = uVar15 & 0xffffff00 | uVar19 | *(int *)(pGVar5 + f) + 0x10U & 0xf0
      ;
      iVar11 = Gem_GroupsDerive(pTruth,uVar19,pCof0,pCof1);
      uVar2 = *(ushort *)(pGVar5 + iVar3);
      pGVar5[iVar3].Predec = f;
      *(uint *)(pGVar5 + iVar3) = iVar11 << 0x10 | uVar2 & 0xffff00ff | (i & 0xffU) << 8;
      Gem_PrintNode(p,iVar10,"Expand  ",0);
      if (p->nObjsAlloc <= p->nObjs) {
        __assert_fail("p->nObjs < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                      ,0xfa,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
      }
      iVar10 = p->nObjs + 1;
      p->nObjs = iVar10;
      if (iVar10 == p->nObjsAlloc) {
        Gem_ManRealloc(p);
      }
    }
    return;
  }
  __assert_fail("(int)pObj->nVars + 2 <= p->nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                ,0xdf,"void Gem_FuncExpand(Gem_Man_t *, int, int)");
}

Assistant:

void Gem_FuncExpand( Gem_Man_t * p, int f, int i )
{
    Gem_Obj_t * pNew = p->pObjs + p->nObjs, * pObj = p->pObjs + f; 
    word * pTruth   = Vec_MemReadEntry( p->vTtMem, f );
    word * pResult  = p->pTtElems[p->nVars];
    word * pCofs[2] = { p->pTtElems[p->nVars+2], p->pTtElems[p->nVars+3] };
    int v, iFunc;
    char pCanonPermC[16];
    assert( i < (int)pObj->nVars );
    assert( (int)pObj->nVars + 2 <= p->nVars );
    Abc_TtCopy( pResult, pTruth, p->nWords, 0 );
    // move i variable to the end
    for ( v = i; v < (int)pObj->nVars-1; v++ )
        Abc_TtSwapAdjacent( pResult, p->nWords, v );
    // create new symmetric group
    assert( v == (int)pObj->nVars-1 );
    Abc_TtCofactor0p( pCofs[0], pResult, p->nWords, v );
    Abc_TtCofactor1p( pCofs[1], pResult, p->nWords, v );
    Abc_TtMaj( pResult, p->pTtElems[v], p->pTtElems[v+1], p->pTtElems[v+2], p->nWords );
    Abc_TtMux( pResult, pResult, pCofs[1], pCofs[0], p->nWords );
    // canonicize
    //Extra_PrintHex( stdout, (unsigned*)pResult, pObj->nVars + 2 ); printf("\n");
    Abc_TtCanonicizePerm( pResult, pObj->nVars + 2, pCanonPermC );
    Abc_TtStretch6( pResult, Abc_MaxInt(6, pObj->nVars+2), p->nVars );
    //Extra_PrintHex( stdout, (unsigned*)pResult, pObj->nVars + 2 ); printf("\n\n");
    iFunc = Vec_MemHashInsert( p->vTtMem, pResult );
    if ( iFunc < p->nObjs )
        return;
    assert( iFunc == p->nObjs );
    pNew->nVars   = pObj->nVars + 2;
    pNew->nNodes  = pObj->nNodes + 1;
    pNew->Groups  = Gem_GroupsDerive( pResult, pNew->nVars, pCofs[0], pCofs[1] );
    pNew->Predec  = f;
    pNew->History = i; 
    Gem_PrintNode( p, iFunc, "Expand  ", 0 );

    assert( p->nObjs < p->nObjsAlloc );
    if ( ++p->nObjs == p->nObjsAlloc )
        Gem_ManRealloc( p );
}